

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O1

void __thiscall RegVmLoweredFunction::CompleteUse(RegVmLoweredFunction *this,VmValue *value)

{
  uint uVar1;
  VmValue **ppVVar2;
  VmValue **ppVVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
    value = (VmValue *)0x0;
  }
  if (value == (VmValue *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x80,"void RegVmLoweredFunction::CompleteUse(VmValue *)");
  }
  uVar7 = (ulong)(value->users).count;
  if (uVar7 != 0) {
    ppVVar2 = (value->users).data;
    ppVVar3 = value[1].users.data;
    if (ppVVar3 != (*ppVVar2)[1].users.data) {
      return;
    }
    uVar4 = 1;
    do {
      uVar6 = uVar4;
      if (uVar7 == uVar6) break;
      uVar4 = uVar6 + 1;
    } while (ppVVar3 == ppVVar2[uVar6][1].users.data);
    if (uVar6 < uVar7) {
      return;
    }
  }
  if (*(int *)&value[1]._vptr_VmValue != 0x4d) {
    uVar1 = (value->users).count;
    uVar5 = *(uint *)(value[1].users.little + 6);
    if (uVar1 <= uVar5) {
      __assert_fail("instruction->regVmCompletedUsers < instruction->users.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x8a,"void RegVmLoweredFunction::CompleteUse(VmValue *)");
    }
    uVar5 = uVar5 + 1;
    *(uint *)(value[1].users.little + 6) = uVar5;
    if ((uVar5 == uVar1) && (*(int *)(value[1].users.little + 3) != 0)) {
      uVar7 = 0;
      do {
        FreeRegister(this,*(uchar *)((long)(value[1].users.little[2]->users).little + (uVar7 - 0x50)
                                    ));
        uVar7 = uVar7 + 1;
      } while (uVar7 < *(uint *)(value[1].users.little + 3));
    }
  }
  return;
}

Assistant:

void RegVmLoweredFunction::CompleteUse(VmValue *value)
{
	VmInstruction *instruction = getType<VmInstruction>(value);

	assert(instruction);

	// Can't free instruction register if instruction has uses in multiple blocks, if the register gets used by a different instruction, they might intefere later
	if(IsNonLocalValue(instruction))
		return;

	// Phi instruction shares register ownership for instructions in different blocks, if this registers gets used by a different instruction, they might intefere later
	if(instruction->cmd == VM_INST_PHI)
		return;

	assert(instruction->regVmCompletedUsers < instruction->users.size());

	instruction->regVmCompletedUsers++;

	if(instruction->regVmCompletedUsers == instruction->users.size())
	{
		for(unsigned i = 0; i < instruction->regVmRegisters.size(); i++)
			FreeRegister(instruction->regVmRegisters[i]);
	}
}